

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

ConfidentialAssetId *
cfd::core::ConfidentialTransaction::CalculateReissuanceToken
          (ConfidentialAssetId *__return_storage_ptr__,BlindFactor *entropy,bool is_blind)

{
  uint uVar1;
  uchar *puVar2;
  size_type sVar3;
  uchar *puVar4;
  size_type sVar5;
  CfdException *this;
  ByteData local_e8;
  undefined1 local_ca;
  allocator local_c9;
  string local_c8;
  CfdSourceLocation local_a8;
  int local_8c;
  uint local_88;
  int ret;
  uint32_t flag;
  vector<unsigned_char,_std::allocator<unsigned_char>_> token;
  ByteData256 local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *entropy_byte;
  BlindFactor *pBStack_18;
  bool is_blind_local;
  BlindFactor *entropy_local;
  
  entropy_byte._7_1_ = is_blind;
  pBStack_18 = entropy;
  entropy_local = (BlindFactor *)__return_storage_ptr__;
  BlindFactor::GetData(&local_58,entropy);
  ByteData256::GetBytes(&local_40,&local_58);
  ByteData256::~ByteData256(&local_58);
  local_28 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&ret + 3));
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&flag,0x20,
             (allocator<unsigned_char> *)((long)&ret + 3));
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&ret + 3));
  local_88 = entropy_byte._7_1_ & 1;
  puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_28);
  sVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_28);
  uVar1 = local_88;
  puVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&flag);
  sVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&flag);
  local_8c = wally_tx_elements_issuance_calculate_reissuance_token(puVar2,sVar3,uVar1,puVar4,sVar5);
  if (local_8c != 0) {
    local_a8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_a8.filename = local_a8.filename + 1;
    local_a8.line = 0x841;
    local_a8.funcname = "CalculateReissuanceToken";
    logger::warn<int&>(&local_a8,"wally_tx_elements_issuance_calculate_reissuance_token NG[{}].",
                       &local_8c);
    local_ca = 1;
    this = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_c8,"token calculate error.",&local_c9);
    CfdException::CfdException(this,kCfdIllegalStateError,&local_c8);
    local_ca = 0;
    __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::ByteData(&local_e8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&flag);
  ConfidentialAssetId::ConfidentialAssetId(__return_storage_ptr__,&local_e8);
  ByteData::~ByteData(&local_e8);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&flag);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

ConfidentialAssetId ConfidentialTransaction::CalculateReissuanceToken(
    const BlindFactor &entropy, bool is_blind) {
  const std::vector<uint8_t> &entropy_byte = entropy.GetData().GetBytes();

  std::vector<uint8_t> token(kAssetSize);
  uint32_t flag = (is_blind) ? WALLY_TX_FLAG_BLINDED_INITIAL_ISSUANCE : 0;
  int ret = wally_tx_elements_issuance_calculate_reissuance_token(
      entropy_byte.data(), entropy_byte.size(), flag, token.data(),
      token.size());
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE,
        "wally_tx_elements_issuance_calculate_reissuance_token NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "token calculate error.");
  }

  return ConfidentialAssetId(ByteData(token));
}